

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

void __thiscall PClass::Derive(PClass *this,PClass *newclass,FName *name)

{
  char *pcVar1;
  FName *name_local;
  PClass *newclass_local;
  PClass *this_local;
  
  newclass->bRuntimeClass = true;
  newclass->ParentClass = this;
  newclass->ConstructNative = this->ConstructNative;
  PSymbolTable::SetParentTable
            (&(newclass->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.
              super_PType.Symbols,
             &(this->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.
              super_PType.Symbols);
  FName::operator=(&(newclass->super_PNativeStruct).super_PStruct.super_PNamedType.TypeName,name);
  pcVar1 = FName::GetChars(name);
  FString::Format(&(newclass->super_PNativeStruct).super_PStruct.super_PNamedType.
                   super_PCompoundType.super_PType.mDescriptiveName,"Class<%s>",pcVar1);
  return;
}

Assistant:

void PClass::Derive(PClass *newclass, FName name)
{
	newclass->bRuntimeClass = true;
	newclass->ParentClass = this;
	newclass->ConstructNative = ConstructNative;
	newclass->Symbols.SetParentTable(&this->Symbols);
	newclass->TypeName = name;
	newclass->mDescriptiveName.Format("Class<%s>", name.GetChars());
}